

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_member_cmp_equal(asmcode *code,compiler_options *param_2)

{
  operation local_8c;
  operand local_88;
  operation local_84;
  operand local_80;
  operation local_7c;
  operand local_78;
  operation local_74;
  operand local_70 [2];
  operation local_68 [2];
  operand local_60 [2];
  operation local_58;
  operand local_54;
  operation local_50;
  operand local_4c [2];
  operation local_44;
  operand local_40 [2];
  operation local_38;
  operand local_34;
  operation local_30;
  operand local_2c;
  operation local_28;
  operand local_24;
  operation local_20 [2];
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_20[1] = 0x3e;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[27]>
            (code,local_20 + 1,(char (*) [27])"L_compile_member_cmp_equal");
  local_20[0] = PUSH;
  local_24 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_20,&local_24);
  local_28 = PUSH;
  local_2c = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_28,&local_2c);
  local_30 = PUSH;
  local_34 = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_30,&local_34);
  local_38 = MOV;
  local_40[1] = 0x14;
  local_40[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_38,local_40 + 1,local_40);
  local_44 = MOV;
  local_4c[1] = 0x18;
  local_4c[0] = LABELADDRESS;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[20]>
            ((asmcode *)param_1_local,&local_44,local_4c + 1,local_4c,
             (char (*) [20])"L_recursively_equal");
  local_50 = CALL;
  local_54 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_50,&local_54);
  local_58 = MOV;
  local_60[1] = 0x14;
  local_60[0] = NUMBER;
  local_68[1] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_58,local_60 + 1,local_60,(int *)(local_68 + 1));
  local_68[0] = CMP;
  local_70[1] = 9;
  local_70[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_68,local_70 + 1,local_70);
  local_74 = POP;
  local_78 = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_74,&local_78);
  local_7c = POP;
  local_80 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_7c,&local_80);
  local_84 = POP;
  local_88 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_84,&local_88);
  local_8c = RET;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,&local_8c);
  return;
}

Assistant:

void compile_member_cmp_equal(asmcode& code, const compiler_options&)
  {
  // this method gets its arguments in rax and r15, and sets the Z flag
  code.add(asmcode::LABEL, "L_compile_member_cmp_equal");
  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::PUSH, asmcode::R15);
  code.add(asmcode::PUSH, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, asmcode::LABELADDRESS, "L_recursively_equal");
  code.add(asmcode::CALL, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, bool_t);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::R11);
  code.add(asmcode::POP, asmcode::RAX);
  code.add(asmcode::POP, asmcode::R15);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::RET);
  }